

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unzip.c
# Opt level: O2

unzFile unzOpenInternal(void *path,zlib_filefunc64_32_def *pzlib_filefunc64_32_def,
                       int is64bitOpenFunction)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  voidpf pvVar9;
  void *pvVar10;
  uLong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  uLong uVar16;
  zlib_filefunc64_32_def *pzVar17;
  uint uVar18;
  ZPOS64_T ZVar19;
  ulong uVar20;
  uint uVar21;
  bool bVar22;
  uLong uL;
  long local_1b8;
  voidpf local_1b0;
  uLong number_disk;
  uLong number_disk_with_CD;
  uLong local_198;
  ZPOS64_T uL64;
  uLong uS;
  zlib_filefunc64_32_def local_180;
  int local_128;
  voidpf local_120;
  uLong local_118 [6];
  ulong local_e8;
  uLong local_e0;
  uLong local_d8 [19];
  undefined8 local_40;
  undefined4 local_38;
  undefined4 local_34;
  
  local_180.ztell32_file = (tell_file_func)0x0;
  local_180.zseek32_file = (seek_file_func)0x0;
  if (pzlib_filefunc64_32_def == (zlib_filefunc64_32_def *)0x0) {
    fill_fopen64_filefunc(&local_180.zfile_func64);
  }
  else {
    pzVar17 = &local_180;
    for (lVar12 = 0xb; lVar12 != 0; lVar12 = lVar12 + -1) {
      (pzVar17->zfile_func64).zopen64_file = (pzlib_filefunc64_32_def->zfile_func64).zopen64_file;
      pzlib_filefunc64_32_def =
           (zlib_filefunc64_32_def *)&(pzlib_filefunc64_32_def->zfile_func64).zread_file;
      pzVar17 = (zlib_filefunc64_32_def *)&(pzVar17->zfile_func64).zread_file;
    }
  }
  local_128 = is64bitOpenFunction;
  pvVar9 = call_zopen64(&local_180,path,5);
  if (pvVar9 != (voidpf)0x0) {
    local_120 = pvVar9;
    lVar12 = call_zseek64(&local_180,pvVar9,0,2);
    if (lVar12 == 0) {
      ZVar19 = call_ztell64(&local_180,pvVar9);
      uVar14 = 0xffff;
      if (ZVar19 < 0xffff) {
        uVar14 = ZVar19;
      }
      pvVar10 = malloc(0x404);
      if (pvVar10 != (void *)0x0) {
        local_1b8 = ZVar19 - 1;
        uVar15 = 4;
        local_1b0 = pvVar9;
        do {
          pvVar9 = local_1b0;
          if (uVar14 <= uVar15) {
LAB_001a40b8:
            ZVar19 = 0;
LAB_001a40bb:
            free(pvVar10);
            pvVar9 = local_1b0;
            if ((((((ZVar19 == 0) ||
                   (lVar12 = call_zseek64(&local_180,local_1b0,ZVar19,0), lVar12 != 0)) ||
                  ((iVar4 = unz64local_getLong(&local_180,pvVar9,&uL), iVar4 != 0 ||
                   ((iVar4 = unz64local_getLong(&local_180,pvVar9,&uL), iVar4 != 0 || (uL != 0))))))
                 || (iVar4 = unz64local_getLong64(&local_180,pvVar9,&number_disk), iVar4 != 0)) ||
                ((((iVar4 = unz64local_getLong(&local_180,pvVar9,&uL), uVar16 = number_disk,
                   iVar4 != 0 || (uL != 1)) ||
                  (lVar12 = call_zseek64(&local_180,pvVar9,number_disk,0), lVar12 != 0)) ||
                 ((iVar4 = unz64local_getLong(&local_180,pvVar9,&uL), iVar4 != 0 ||
                  (uL != 0x6064b50)))))) || (uVar16 == 0)) break;
            local_34 = 1;
            lVar12 = call_zseek64(&local_180,local_120,uVar16,0);
            local_1b8 = CONCAT71(local_1b8._1_7_,lVar12 != 0);
            iVar4 = unz64local_getLong(&local_180,local_120,&uL);
            iVar5 = unz64local_getLong64(&local_180,local_120,&uL64);
            iVar6 = unz64local_getShort(&local_180,local_120,&uS);
            iVar7 = unz64local_getShort(&local_180,local_120,&uS);
            local_1b0 = (voidpf)uVar16;
            iVar8 = unz64local_getLong(&local_180,local_120,&number_disk);
            iVar1 = unz64local_getLong(&local_180,local_120,&number_disk_with_CD);
            iVar2 = unz64local_getLong64(&local_180,local_120,local_118);
            iVar3 = unz64local_getLong64(&local_180,local_120,&local_198);
            uVar21 = 0xffffff99;
            if ((local_198 == local_118[0] && number_disk_with_CD == 0) && number_disk == 0) {
              uVar21 = -(uint)((((iVar7 != 0 || iVar6 != 0) ||
                                ((iVar3 != 0 || iVar2 != 0) || (iVar1 != 0 || iVar8 != 0))) ||
                               (iVar5 != 0 || iVar4 != 0)) | (byte)local_1b8);
            }
            iVar4 = unz64local_getLong64(&local_180,local_120,&local_e0);
            iVar5 = unz64local_getLong64(&local_180,local_120,local_d8);
            uVar18 = 0xffffffff;
            if (iVar5 == 0 && iVar4 == 0) {
              uVar18 = uVar21;
            }
            local_118[1] = 0;
            goto LAB_001a4459;
          }
          uVar20 = uVar15 + 0x400;
          uVar15 = uVar14;
          if (uVar20 < uVar14) {
            uVar15 = uVar20;
          }
          uVar16 = 0x404;
          if (uVar15 < 0x404) {
            uVar16 = uVar15;
          }
          lVar12 = call_zseek64(&local_180,local_1b0,ZVar19 - uVar15,0);
          if ((lVar12 != 0) ||
             (uVar11 = (*local_180.zfile_func64.zread_file)
                                 (local_180.zfile_func64.opaque,pvVar9,pvVar10,uVar16),
             uVar11 != uVar16)) goto LAB_001a40b8;
          uVar13 = (ulong)((int)uVar16 - 3);
          for (lVar12 = 0; 0 < (int)lVar12 + (int)uVar16 + -3; lVar12 = lVar12 + -1) {
            if ((((*(char *)((long)pvVar10 + lVar12 + (uVar13 - 1)) == 'P') &&
                 (*(char *)((long)pvVar10 + lVar12 + uVar13) == 'K')) &&
                (*(char *)((long)pvVar10 + lVar12 + uVar13 + 1) == '\x06')) &&
               (*(char *)((long)pvVar10 + lVar12 + uVar13 + 2) == '\a')) {
              if (((uVar13 + local_1b8) - uVar15) + lVar12 != 0) {
                if (ZVar19 < uVar20) {
                  uVar20 = ZVar19;
                }
                uVar14 = 0x404;
                if (uVar20 < 0x404) {
                  uVar14 = uVar20;
                }
                if (0xfffe < uVar20) {
                  uVar20 = 0xffff;
                }
                ZVar19 = ~uVar20 + lVar12 + ((int)uVar14 - 3) + ZVar19;
                goto LAB_001a40bb;
              }
              break;
            }
          }
        } while( true );
      }
    }
    pvVar9 = local_120;
    lVar12 = call_zseek64(&local_180,local_120,0,2);
    ZVar19 = 0;
    uVar21 = 0xffffffff;
    if (lVar12 == 0) {
      local_1b0 = pvVar9;
      ZVar19 = call_ztell64(&local_180,pvVar9);
      uVar14 = 0xffff;
      if (ZVar19 < 0xffff) {
        uVar14 = ZVar19;
      }
      pvVar10 = malloc(0x404);
      pvVar9 = local_1b0;
      if (pvVar10 != (void *)0x0) {
        uVar15 = 4;
        local_1b8 = ZVar19 - 1;
        do {
          if (uVar14 <= uVar15) {
LAB_001a4319:
            ZVar19 = 0;
LAB_001a431c:
            free(pvVar10);
            uVar21 = -(uint)(ZVar19 == 0);
            goto LAB_001a4336;
          }
          uVar20 = uVar15 + 0x400;
          uVar15 = uVar14;
          if (uVar20 < uVar14) {
            uVar15 = uVar20;
          }
          uVar16 = 0x404;
          if (uVar15 < 0x404) {
            uVar16 = uVar15;
          }
          lVar12 = call_zseek64(&local_180,pvVar9,ZVar19 - uVar15,0);
          if ((lVar12 != 0) ||
             (uVar11 = (*local_180.zfile_func64.zread_file)
                                 (local_180.zfile_func64.opaque,pvVar9,pvVar10,uVar16),
             uVar11 != uVar16)) goto LAB_001a4319;
          uVar13 = (ulong)((int)uVar16 - 3);
          for (lVar12 = 0; 0 < (int)lVar12 + (int)uVar16 + -3; lVar12 = lVar12 + -1) {
            if ((((*(char *)((long)pvVar10 + lVar12 + (uVar13 - 1)) == 'P') &&
                 (*(char *)((long)pvVar10 + lVar12 + uVar13) == 'K')) &&
                (*(char *)((long)pvVar10 + lVar12 + uVar13 + 1) == '\x05')) &&
               (*(char *)((long)pvVar10 + lVar12 + uVar13 + 2) == '\x06')) {
              if (((uVar13 + local_1b8) - uVar15) + lVar12 != 0) {
                if (ZVar19 < uVar20) {
                  uVar20 = ZVar19;
                }
                uVar14 = 0x404;
                if (uVar20 < 0x404) {
                  uVar14 = uVar20;
                }
                if (0xfffe < uVar20) {
                  uVar20 = 0xffff;
                }
                ZVar19 = ~uVar20 + lVar12 + ((int)uVar14 - 3) + ZVar19;
                goto LAB_001a431c;
              }
              break;
            }
          }
        } while( true );
      }
      ZVar19 = 0;
    }
LAB_001a4336:
    local_34 = 0;
    local_1b0 = (voidpf)ZVar19;
    local_1b8 = call_zseek64(&local_180,local_120,ZVar19,0);
    iVar4 = unz64local_getLong(&local_180,local_120,&uL);
    iVar5 = unz64local_getShort(&local_180,local_120,&number_disk);
    iVar6 = unz64local_getShort(&local_180,local_120,&number_disk_with_CD);
    iVar7 = unz64local_getShort(&local_180,local_120,&uL);
    local_118[0] = uL;
    iVar8 = unz64local_getShort(&local_180,local_120,&uL);
    bVar22 = local_1b8 != 0;
    local_1b8 = -local_1b8;
    uVar21 = -(uint)bVar22 | uVar21;
    if ((iVar8 != 0 || iVar7 != 0) || (iVar6 != 0 || (iVar5 != 0 || iVar4 != 0))) {
      uVar21 = 0xffffffff;
    }
    uVar18 = 0xffffff99;
    if ((uL == local_118[0] && number_disk_with_CD == 0) && number_disk == 0) {
      uVar18 = uVar21;
    }
    iVar4 = unz64local_getLong(&local_180,local_120,&uL);
    local_e0 = uL;
    iVar5 = unz64local_getLong(&local_180,local_120,&uL);
    local_d8[0] = uL;
    iVar6 = unz64local_getShort(&local_180,local_120,local_118 + 1);
    if (iVar6 != 0 || (iVar5 != 0 || iVar4 != 0)) {
      uVar18 = 0xffffffff;
    }
LAB_001a4459:
    local_118[2] = (long)local_1b0 - (local_e0 + local_d8[0]);
    if ((local_1b0 < local_e0 + local_d8[0]) || (uVar18 != 0)) {
      (*local_180.zfile_func64.zclose_file)(local_180.zfile_func64.opaque,local_120);
    }
    else {
      local_e8 = (ulong)local_1b0;
      local_40 = 0;
      local_38 = 0;
      pvVar10 = malloc(0x150);
      if (pvVar10 != (void *)0x0) {
        memcpy(pvVar10,&local_180,0x150);
        unzGoToFirstFile(pvVar10);
        return pvVar10;
      }
    }
  }
  return (unzFile)0x0;
}

Assistant:

local unzFile unzOpenInternal(const void* path,
    zlib_filefunc64_32_def* pzlib_filefunc64_32_def,
    int is64bitOpenFunction)
{
    unz64_s us;
    unz64_s* s;
    ZPOS64_T central_pos;
    uLong   uL;

    uLong number_disk;          /* number of the current dist, used for
                                   spaning ZIP, unsupported, always 0*/
    uLong number_disk_with_CD;  /* number the the disk with central dir, used
                                   for spaning ZIP, unsupported, always 0*/
    ZPOS64_T number_entry_CD;      /* total number of entries in
                                   the central dir
                                   (same than number_entry on nospan) */

    int err = UNZ_OK;

    if (unz_copyright[0] != ' ')
        return NULL;

    us.z_filefunc.zseek32_file = NULL;
    us.z_filefunc.ztell32_file = NULL;
    if (pzlib_filefunc64_32_def == NULL)
        fill_fopen64_filefunc(&us.z_filefunc.zfile_func64);
    else
        us.z_filefunc = *pzlib_filefunc64_32_def;
    us.is64bitOpenFunction = is64bitOpenFunction;



    us.filestream = ZOPEN64(us.z_filefunc,
        path,
        ZLIB_FILEFUNC_MODE_READ |
        ZLIB_FILEFUNC_MODE_EXISTING);
    if (us.filestream == NULL)
        return NULL;

    central_pos = unz64local_SearchCentralDir64(&us.z_filefunc, us.filestream);
    if (central_pos)
    {
        uLong uS;
        ZPOS64_T uL64;

        us.isZip64 = 1;

        if (ZSEEK64(us.z_filefunc, us.filestream,
            central_pos, ZLIB_FILEFUNC_SEEK_SET) != 0)
            err = UNZ_ERRNO;

        /* the signature, already checked */
        if (unz64local_getLong(&us.z_filefunc, us.filestream, &uL) != UNZ_OK)
            err = UNZ_ERRNO;

        /* size of zip64 end of central directory record */
        if (unz64local_getLong64(&us.z_filefunc, us.filestream, &uL64) != UNZ_OK)
            err = UNZ_ERRNO;

        /* version made by */
        if (unz64local_getShort(&us.z_filefunc, us.filestream, &uS) != UNZ_OK)
            err = UNZ_ERRNO;

        /* version needed to extract */
        if (unz64local_getShort(&us.z_filefunc, us.filestream, &uS) != UNZ_OK)
            err = UNZ_ERRNO;

        /* number of this disk */
        if (unz64local_getLong(&us.z_filefunc, us.filestream, &number_disk) != UNZ_OK)
            err = UNZ_ERRNO;

        /* number of the disk with the start of the central directory */
        if (unz64local_getLong(&us.z_filefunc, us.filestream, &number_disk_with_CD) != UNZ_OK)
            err = UNZ_ERRNO;

        /* total number of entries in the central directory on this disk */
        if (unz64local_getLong64(&us.z_filefunc, us.filestream, &us.gi.number_entry) != UNZ_OK)
            err = UNZ_ERRNO;

        /* total number of entries in the central directory */
        if (unz64local_getLong64(&us.z_filefunc, us.filestream, &number_entry_CD) != UNZ_OK)
            err = UNZ_ERRNO;

        if ((number_entry_CD != us.gi.number_entry) ||
            (number_disk_with_CD != 0) ||
            (number_disk != 0))
            err = UNZ_BADZIPFILE;

        /* size of the central directory */
        if (unz64local_getLong64(&us.z_filefunc, us.filestream, &us.size_central_dir) != UNZ_OK)
            err = UNZ_ERRNO;

        /* offset of start of central directory with respect to the
          starting disk number */
        if (unz64local_getLong64(&us.z_filefunc, us.filestream, &us.offset_central_dir) != UNZ_OK)
            err = UNZ_ERRNO;

        us.gi.size_comment = 0;
    }
    else
    {
        central_pos = unz64local_SearchCentralDir(&us.z_filefunc, us.filestream);
        if (central_pos == 0)
            err = UNZ_ERRNO;

        us.isZip64 = 0;

        if (ZSEEK64(us.z_filefunc, us.filestream,
            central_pos, ZLIB_FILEFUNC_SEEK_SET) != 0)
            err = UNZ_ERRNO;

        /* the signature, already checked */
        if (unz64local_getLong(&us.z_filefunc, us.filestream, &uL) != UNZ_OK)
            err = UNZ_ERRNO;

        /* number of this disk */
        if (unz64local_getShort(&us.z_filefunc, us.filestream, &number_disk) != UNZ_OK)
            err = UNZ_ERRNO;

        /* number of the disk with the start of the central directory */
        if (unz64local_getShort(&us.z_filefunc, us.filestream, &number_disk_with_CD) != UNZ_OK)
            err = UNZ_ERRNO;

        /* total number of entries in the central dir on this disk */
        if (unz64local_getShort(&us.z_filefunc, us.filestream, &uL) != UNZ_OK)
            err = UNZ_ERRNO;
        us.gi.number_entry = uL;

        /* total number of entries in the central dir */
        if (unz64local_getShort(&us.z_filefunc, us.filestream, &uL) != UNZ_OK)
            err = UNZ_ERRNO;
        number_entry_CD = uL;

        if ((number_entry_CD != us.gi.number_entry) ||
            (number_disk_with_CD != 0) ||
            (number_disk != 0))
            err = UNZ_BADZIPFILE;

        /* size of the central directory */
        if (unz64local_getLong(&us.z_filefunc, us.filestream, &uL) != UNZ_OK)
            err = UNZ_ERRNO;
        us.size_central_dir = uL;

        /* offset of start of central directory with respect to the
            starting disk number */
        if (unz64local_getLong(&us.z_filefunc, us.filestream, &uL) != UNZ_OK)
            err = UNZ_ERRNO;
        us.offset_central_dir = uL;

        /* zipfile comment length */
        if (unz64local_getShort(&us.z_filefunc, us.filestream, &us.gi.size_comment) != UNZ_OK)
            err = UNZ_ERRNO;
    }

    if ((central_pos < us.offset_central_dir + us.size_central_dir) &&
        (err == UNZ_OK))
        err = UNZ_BADZIPFILE;

    if (err != UNZ_OK)
    {
        ZCLOSE64(us.z_filefunc, us.filestream);
        return NULL;
    }

    us.byte_before_the_zipfile = central_pos -
        (us.offset_central_dir + us.size_central_dir);
    us.central_pos = central_pos;
    us.pfile_in_zip_read = NULL;
    us.encrypted = 0;


    s = (unz64_s*)ALLOC(sizeof(unz64_s));
    if (s != NULL)
    {
        *s = us;
        unzGoToFirstFile((unzFile)s);
    }
    return (unzFile)s;
}